

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int mg_modify_passwords_file(char *fname,char *domain,char *user,char *pass)

{
  char local_58 [8];
  char ha1buf [33];
  char *pass_local;
  char *user_local;
  char *domain_local;
  char *fname_local;
  
  if (((fname == (char *)0x0) || (domain == (char *)0x0)) || (user == (char *)0x0)) {
    fname_local._4_4_ = 0;
  }
  else {
    unique0x100000a1 = pass;
    if ((pass == (char *)0x0) || (*pass == '\0')) {
      fname_local._4_4_ = mg_modify_passwords_file_ha1(fname,domain,user,(char *)0x0);
    }
    else {
      mg_md5(local_58,user,":",domain,":",pass,0);
      fname_local._4_4_ = mg_modify_passwords_file_ha1(fname,domain,user,local_58);
    }
  }
  return fname_local._4_4_;
}

Assistant:

CIVETWEB_API int
mg_modify_passwords_file(const char *fname,
                         const char *domain,
                         const char *user,
                         const char *pass)
{
	char ha1buf[33];
	if ((fname == NULL) || (domain == NULL) || (user == NULL)) {
		return 0;
	}
	if ((pass == NULL) || (pass[0] == 0)) {
		return mg_modify_passwords_file_ha1(fname, domain, user, NULL);
	}

	mg_md5(ha1buf, user, ":", domain, ":", pass, NULL);
	return mg_modify_passwords_file_ha1(fname, domain, user, ha1buf);
}